

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

wchar_t CVmFormatter::next_wchar(char **s,size_t *len)

{
  size_t sVar1;
  long *in_RSI;
  long *in_RDI;
  size_t charsize;
  wchar_t ret;
  undefined4 local_1c;
  undefined4 local_4;
  
  if (*in_RSI == 0) {
    local_4 = L'\0';
  }
  else {
    local_1c = utf8_ptr::s_getch((char *)*in_RDI);
    sVar1 = utf8_ptr::s_charsize(*(char *)*in_RDI);
    *in_RSI = *in_RSI - sVar1;
    *in_RDI = sVar1 + *in_RDI;
    if (local_1c == L'\0') {
      local_1c = L' ';
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

wchar_t CVmFormatter::next_wchar(const char **s, size_t *len)
{
    wchar_t ret;
    size_t charsize;

    /* if there's nothing left, return a null terminator */
    if (*len == 0)
        return 0;

    /* get this character */
    ret = utf8_ptr::s_getch(*s);

    /* advance the string pointer and length counter */
    charsize = utf8_ptr::s_charsize(**s);
    *len -= charsize;
    *s += charsize;

    /* render embedded null bytes as spaces */
    if (ret == 0)
        ret = ' ';

    /* return the result */
    return ret;
}